

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O1

bool __thiscall
duckdb::TryCastErrorMessageCommaSeparated::Operation<duckdb::string_t,double>
          (TryCastErrorMessageCommaSeparated *this,string_t input,double *result,
          CastParameters *parameters)

{
  bool bVar1;
  char *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params;
  undefined8 local_98;
  char *local_90;
  string local_88;
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  string local_48;
  
  local_90 = input.value._0_8_;
  pcVar2 = local_90;
  if (((ulong)this & 0xffffffff) < 0xd) {
    pcVar2 = (char *)((long)&local_98 + 4);
  }
  params = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (ulong)*(bool *)(result + 1);
  local_98 = this;
  bVar1 = TryDoubleCast<double>
                    (pcVar2,(ulong)this & 0xffffffff,input.value._8_8_,*(bool *)(result + 1),',');
  if (!bVar1) {
    local_68[0] = local_58;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_68,"Could not cast string to double: \"%s\"","");
    pcVar2 = (char *)((long)&local_98 + 4);
    if (0xc < ((ulong)local_98 & 0xffffffff)) {
      pcVar2 = local_90;
    }
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_88,pcVar2,pcVar2 + ((ulong)local_98 & 0xffffffff));
    StringUtil::Format<std::__cxx11::string>(&local_48,(StringUtil *)local_68,&local_88,params);
    HandleCastError::AssignError(&local_48,(CastParameters *)result);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    if (local_68[0] != local_58) {
      operator_delete(local_68[0]);
    }
  }
  return bVar1;
}

Assistant:

bool TryCastErrorMessageCommaSeparated::Operation(string_t input, double &result, CastParameters &parameters) {
	if (!TryDoubleCast<double>(input.GetData(), input.GetSize(), result, parameters.strict, ',')) {
		HandleCastError::AssignError(StringUtil::Format("Could not cast string to double: \"%s\"", input.GetString()),
		                             parameters);
		return false;
	}
	return true;
}